

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

void Gia_QbfFree(Qbf_Man_t *p)

{
  Vec_Int_t *pVVar1;
  
  sat_solver_delete(p->pSatVer);
  sat_solver_delete(p->pSatSyn);
  if (p->pSatSynG != (bmcg_sat_solver *)0x0) {
    bmcg_sat_solver_stop(p->pSatSynG);
  }
  pVVar1 = p->vLits;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vValues;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vParMap;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Qbf_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_QbfFree( Qbf_Man_t * p )
{
    sat_solver_delete( p->pSatVer );
    sat_solver_delete( p->pSatSyn );
    if ( p->pSatSynG ) bmcg_sat_solver_stop( p->pSatSynG );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vValues );
    Vec_IntFree( p->vParMap );
    ABC_FREE( p );
}